

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_get(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  SQObjectPtr *self;
  SQObjectPtr *key;
  SQRESULT SVar2;
  
  self = stack_get(v,idx);
  key = SQVM::GetUp(v,-1);
  bVar1 = SQVM::Get(v,self,key,key,0,0x29a);
  SVar2 = 0;
  if (!bVar1) {
    SQVM::Pop(v);
    SVar2 = -1;
  }
  return SVar2;
}

Assistant:

SQRESULT sq_get(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &self=stack_get(v,idx);
    SQObjectPtr &obj = v->GetUp(-1);
    if(v->Get(self,obj,obj,false,DONT_FALL_BACK))
        return SQ_OK;
    v->Pop();
    return SQ_ERROR;
}